

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_DamageTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int amount;
  int selector;
  bool bVar1;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar2;
  AActor *pAVar3;
  int iVar4;
  int selector_00;
  char *pcVar5;
  int iVar6;
  int local_44;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003ece00;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ecdd1:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ece00:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16dd,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003ecbf0;
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ece00;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003ecdd1;
LAB_003ecbf0:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003ece28:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16de,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ece28;
  }
  amount = param[1].field_0.i;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003eceb6;
    }
    iVar6 = param[2].field_0.i;
LAB_003ecc43:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eced5:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e0,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_44 = param[3].field_0.i;
LAB_003ecc52:
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003ecdda:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ecde1:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e1,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003ecdda;
      local_40 = (PClassActor *)0x0;
    }
LAB_003ecc74:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ece85:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e2,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[5].field_0.i;
LAB_003ecc83:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ece66:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16e3,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003eceb6:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16df,
                    "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ecc43;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eced5;
    }
    local_44 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ecc52;
    }
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[4].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ecde1;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ecc74;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ece85;
    }
    iVar4 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ecc83;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ece66;
    }
    selector_00 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ece47;
      }
      goto LAB_003eccaa;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ece47:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16e4,
                  "int AF_AActor_A_DamageTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003eccaa:
  selector = param[7].field_0.i;
  source = COPY_AAPTR(pAVar3,selector_00);
  inflictor = COPY_AAPTR(pAVar3,selector);
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->target);
  if (pAVar2 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->target);
    local_38.Index = iVar4;
    local_34.Index = iVar6;
    DoDamage(pAVar3,inflictor,source,amount,&local_34,local_44,local_40,&local_38);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->target != NULL)
		DoDamage(self->target, inflictor, source, amount, damagetype, flags, filter, species);
	return 0;
}